

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O0

optional<unsigned_char> parseDec<unsigned_char>(string *str,size_type *n)

{
  char *pcVar1;
  char *pcVar2;
  size_type sVar3;
  __integer_from_chars_result_type<unsigned_long> _Var4;
  __integer_from_chars_result_type<unsigned_long> result;
  uintmax_t value;
  size_type *n_local;
  string *str_local;
  
  result.ec = 0;
  result._12_4_ = 0;
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (str);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (str);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(str)
  ;
  _Var4 = std::from_chars<unsigned_long>(pcVar1,pcVar2 + sVar3,(unsigned_long *)&result.ec,10);
  result.ptr._0_4_ = _Var4.ec;
  if ((errc)result.ptr == 0) {
    pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (str);
    *n = (size_type)(_Var4.ptr + (*n - (long)pcVar1));
    std::optional<unsigned_char>::optional<unsigned_long_&,_true>
              ((optional<unsigned_char> *)((long)&str_local + 6),(unsigned_long *)&result.ec);
  }
  else {
    std::optional<unsigned_char>::optional((optional<unsigned_char> *)((long)&str_local + 6));
  }
  return (_Optional_base<unsigned_char,_true,_true>)
         (_Optional_base<unsigned_char,_true,_true>)str_local._6_2_;
}

Assistant:

static std::optional<U> parseDec(std::string const &str, std::string::size_type &n) {
	uintmax_t value = 0;
	auto result = std::from_chars(str.data(), str.data() + str.size(), value);
	if ((bool)result.ec) {
		return std::nullopt;
	}
	n += result.ptr - str.data();
	return std::optional<U>{value};
}